

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O1

bool booster::regex_search<booster::regex>(char *begin,char *end,cmatch *m,regex *r,int flags)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  char cVar4;
  pointer local_38;
  pointer ppStack_30;
  pointer local_28;
  
  local_38 = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  cVar4 = booster::regex::search((char *)r,begin,(vector *)end,(int)&local_38);
  if (cVar4 != '\0') {
    m->begin_ = begin;
    m->end_ = end;
    ppVar1 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    ppVar2 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar3 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = local_38;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppStack_30;
    local_38 = ppVar2;
    ppStack_30 = ppVar3;
    local_28 = ppVar1;
  }
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38);
  }
  return (bool)cVar4;
}

Assistant:

bool regex_search(char const *begin,char const *end,cmatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		bool res = r.search(begin,end,map,flags);
		if(!res) return false;
		m.assign(begin,end,map);
		return true;
	}